

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  size_t sVar2;
  char *name;
  size_t modified_path_len;
  int i;
  int is_ok;
  Context context;
  Command command;
  char **argv_local;
  int argc_local;
  
  modified_path_len._4_4_ = 1;
  i = 0xb;
  is_ok = -1;
  context.quality = 0;
  context.lgwin = 0;
  context.verbosity = 0;
  context.force_overwrite = 1;
  context.copy_stat = 0;
  context.junk_source = 0;
  context.write_to_stdout = 0;
  context.test_integrity = 0;
  context.decompress = 0;
  context.large_window = 0;
  context.output_path = ".br";
  for (modified_path_len._0_4_ = 0; (int)modified_path_len < 0x14;
      modified_path_len._0_4_ = (int)modified_path_len + 1) {
    context.not_input_indices[(long)(int)modified_path_len + -2] = 0;
  }
  context.not_input_indices[0x12] = 1;
  context.not_input_indices[0x13] = 0;
  context.longest_path_len = 0;
  context.argv = (char **)0x0;
  context.modified_path._0_4_ = 0;
  context.modified_path._4_4_ = 0;
  context.iterator = 0;
  context.iterator_error = 0;
  context._188_4_ = 0;
  context.output = (uint8_t *)0x0;
  context.current_input_path = (char *)0x0;
  context.input_file_length = 0;
  context.fin = (FILE *)0x0;
  context.input_count._0_4_ = argc;
  context._152_8_ = argv;
  context.total_out._4_4_ = ParseParams((Context *)&i);
  uVar1 = context.not_input_indices._72_8_;
  if (((context.total_out._4_4_ == COMMAND_COMPRESS) ||
      (context.total_out._4_4_ == COMMAND_DECOMPRESS)) ||
     (context.total_out._4_4_ == COMMAND_TEST_INTEGRITY)) {
    sVar2 = strlen(context.output_path);
    context.argv = (char **)malloc(uVar1 + sVar2 + 1);
    context._184_8_ = malloc(0x100000);
    if ((context.argv == (char **)0x0) || ((uint8_t *)context._184_8_ == (uint8_t *)0x0)) {
      fprintf(_stderr,"out of memory\n");
      modified_path_len._4_4_ = 0;
    }
    else {
      context.input = (uint8_t *)(context._184_8_ + 0x80000);
      context.buffer = (uint8_t *)context._184_8_;
    }
  }
  if (modified_path_len._4_4_ == 0) {
    context.total_out._4_4_ = COMMAND_NOOP;
  }
  switch(context.total_out._4_4_) {
  case COMMAND_COMPRESS:
    modified_path_len._4_4_ = CompressFiles((Context *)&i);
    break;
  case COMMAND_DECOMPRESS:
  case COMMAND_TEST_INTEGRITY:
    modified_path_len._4_4_ = DecompressFiles((Context *)&i);
    break;
  case COMMAND_HELP:
  case COMMAND_INVALID:
  default:
    modified_path_len._4_4_ = (uint)(context.total_out._4_4_ == COMMAND_HELP);
    name = FileName(*argv);
    PrintHelp(name,modified_path_len._4_4_);
    break;
  case COMMAND_NOOP:
    break;
  case COMMAND_VERSION:
    PrintVersion();
  }
  if (context.iterator != 0) {
    modified_path_len._4_4_ = 0;
  }
  free(context.argv);
  free((void *)context._184_8_);
  if (modified_path_len._4_4_ == 0) {
    exit(1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  Command command;
  Context context;
  BROTLI_BOOL is_ok = BROTLI_TRUE;
  int i;

  context.quality = 11;
  context.lgwin = -1;
  context.verbosity = 0;
  context.force_overwrite = BROTLI_FALSE;
  context.junk_source = BROTLI_FALSE;
  context.copy_stat = BROTLI_TRUE;
  context.test_integrity = BROTLI_FALSE;
  context.write_to_stdout = BROTLI_FALSE;
  context.decompress = BROTLI_FALSE;
  context.large_window = BROTLI_FALSE;
  context.output_path = NULL;
  context.suffix = DEFAULT_SUFFIX;
  for (i = 0; i < MAX_OPTIONS; ++i) context.not_input_indices[i] = 0;
  context.longest_path_len = 1;
  context.input_count = 0;

  context.argc = argc;
  context.argv = argv;
  context.modified_path = NULL;
  context.iterator = 0;
  context.ignore = 0;
  context.iterator_error = BROTLI_FALSE;
  context.buffer = NULL;
  context.current_input_path = NULL;
  context.current_output_path = NULL;
  context.fin = NULL;
  context.fout = NULL;

  command = ParseParams(&context);

  if (command == COMMAND_COMPRESS || command == COMMAND_DECOMPRESS ||
      command == COMMAND_TEST_INTEGRITY) {
    if (is_ok) {
      size_t modified_path_len =
          context.longest_path_len + strlen(context.suffix) + 1;
      context.modified_path = (char*)malloc(modified_path_len);
      context.buffer = (uint8_t*)malloc(kFileBufferSize * 2);
      if (!context.modified_path || !context.buffer) {
        fprintf(stderr, "out of memory\n");
        is_ok = BROTLI_FALSE;
      } else {
        context.input = context.buffer;
        context.output = context.buffer + kFileBufferSize;
      }
    }
  }

  if (!is_ok) command = COMMAND_NOOP;

  switch (command) {
    case COMMAND_NOOP:
      break;

    case COMMAND_VERSION:
      PrintVersion();
      break;

    case COMMAND_COMPRESS:
      is_ok = CompressFiles(&context);
      break;

    case COMMAND_DECOMPRESS:
    case COMMAND_TEST_INTEGRITY:
      is_ok = DecompressFiles(&context);
      break;

    case COMMAND_HELP:
    case COMMAND_INVALID:
    default:
      is_ok = (command == COMMAND_HELP);
      PrintHelp(FileName(argv[0]), is_ok);
      break;
  }

  if (context.iterator_error) is_ok = BROTLI_FALSE;

  free(context.modified_path);
  free(context.buffer);

  if (!is_ok) exit(1);
  return 0;
}